

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O3

void __thiscall
duckdb::RleBpEncoder::WriteMany(RleBpEncoder *this,WriteStream *writer,uint32_t value,idx_t count)

{
  idx_t iVar1;
  bool bVar2;
  uint32_t local_24;
  
  if (this->rle_count != 0) {
    WriteValue(this,writer,&local_24);
    count = count - 1;
  }
  if (this->bp_block_count != 0) {
    if (count == 0) {
      count = 0;
    }
    else {
      iVar1 = count;
      do {
        WriteValue(this,writer,&local_24);
        count = iVar1 - 1;
        if (this->bp_block_count == 0) break;
        bVar2 = iVar1 != 1;
        iVar1 = count;
      } while (bVar2);
    }
  }
  this->rle_value = value;
  this->rle_count = this->rle_count + count;
  return;
}

Assistant:

void WriteMany(WriteStream &writer, uint32_t value, idx_t count) {
		if (rle_count != 0) {
			// If an RLE run is going on, write a single value to either finish it or convert to BP
			WriteValue(writer, value);
			count--;
		}

		if (bp_block_count != 0) {
			// If a BP run is going on, finish it
			while (bp_block_count != 0 && count > 0) {
				WriteValue(writer, value);
				count--;
			}
		}

		// Set remaining as current RLE run
		rle_value = value;
		rle_count += count;
	}